

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> * __thiscall
wallet::CWallet::GetWalletDescriptors
          (vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>
           *__return_storage_ptr__,CWallet *this,CScript *script)

{
  _Rb_tree_header *p_Var1;
  DescriptorScriptPubKeyMan *this_00;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  unique_lock<std::recursive_mutex> local_168;
  WalletDescriptor local_158;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetScriptPubKeyMans((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                       *)&local_68,this,script);
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var2 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (*(long *)(p_Var2 + 1) == 0) {
        this_00 = (DescriptorScriptPubKeyMan *)0x0;
      }
      else {
        this_00 = (DescriptorScriptPubKeyMan *)
                  __dynamic_cast(*(long *)(p_Var2 + 1),&ScriptPubKeyMan::typeinfo,
                                 &DescriptorScriptPubKeyMan::typeinfo,0);
      }
      if (this_00 != (DescriptorScriptPubKeyMan *)0x0) {
        local_168._M_device = &(this_00->cs_desc_man).super_recursive_mutex;
        local_168._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&local_168);
        DescriptorScriptPubKeyMan::GetWalletDescriptor(&local_158,this_00);
        std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>::
        emplace_back<wallet::WalletDescriptor>(__return_storage_ptr__,&local_158);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_158.cache.m_last_hardened_xpubs._M_h);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_158.cache.m_parent_xpubs._M_h);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_158.cache);
        if (local_158.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_168);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<WalletDescriptor> CWallet::GetWalletDescriptors(const CScript& script) const
{
    std::vector<WalletDescriptor> descs;
    for (const auto spk_man: GetScriptPubKeyMans(script)) {
        if (const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man)) {
            LOCK(desc_spk_man->cs_desc_man);
            descs.push_back(desc_spk_man->GetWalletDescriptor());
        }
    }
    return descs;
}